

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ShaderSubroutine::NegativeTest5::executeIteration
          (NegativeTest5 *this,_shader_stage *shader_stage)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  NegativeTest5 *this_01;
  string vs_body;
  string te_body;
  string tc_body;
  string gs_body;
  string fs_body;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  this_01 = (NegativeTest5 *)shader_stage;
  getFragmentShaderBody_abi_cxx11_
            (&fs_body,(NegativeTest5 *)shader_stage,*shader_stage == SHADER_STAGE_FRAGMENT);
  getGeometryShaderBody_abi_cxx11_(&gs_body,this_01,*shader_stage == SHADER_STAGE_GEOMETRY);
  getTessellationControlShaderBody_abi_cxx11_
            (&tc_body,this_01,*shader_stage == SHADER_STAGE_TESSELLATION_CONTROL);
  getTessellationEvaluationShaderBody_abi_cxx11_
            (&te_body,this_01,*shader_stage == SHADER_STAGE_TESSELLATION_EVALUATION);
  getVertexShaderBody_abi_cxx11_(&vs_body,this_01,*shader_stage == SHADER_STAGE_FIRST);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1b0._0_8_ = (ulong)(uint)local_1b0._4_4_ << 0x20;
  bVar1 = Utils::buildProgram((Functions *)CONCAT44(extraout_var,iVar2),&vs_body,&tc_body,&te_body,
                              &gs_body,&fs_body,(GLchar **)0x0,(uint *)local_1b0,&this->m_vs_id,
                              &this->m_tc_id,&this->m_te_id,&this->m_gs_id,&this->m_fs_id,
                              &this->m_po_id);
  if (bVar1) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "A program object, consisting of the following shaders, has linked correctly. One of the shaders defines a subroutine uniform but does not implement any function that matches subroutine type of the uniform. This should have resulted in a compilation/link-time error.\n\nVertex shader:\n\n"
               ,0x11b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,vs_body._M_dataplus._M_p,vs_body._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"\nTessellation control shader:\n\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,tc_body._M_dataplus._M_p,tc_body._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"\nTessellation evaluation shader:\n\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,te_body._M_dataplus._M_p,te_body._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"\nGeometry shader:\n\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,gs_body._M_dataplus._M_p,gs_body._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"\nFragment shader:\n\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,fs_body._M_dataplus._M_p,fs_body._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    this->m_has_test_passed = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vs_body._M_dataplus._M_p != &vs_body.field_2) {
    operator_delete(vs_body._M_dataplus._M_p,vs_body.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)te_body._M_dataplus._M_p != &te_body.field_2) {
    operator_delete(te_body._M_dataplus._M_p,te_body.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tc_body._M_dataplus._M_p != &tc_body.field_2) {
    operator_delete(tc_body._M_dataplus._M_p,tc_body.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gs_body._M_dataplus._M_p != &gs_body.field_2) {
    operator_delete(gs_body._M_dataplus._M_p,gs_body.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fs_body._M_dataplus._M_p != &fs_body.field_2) {
    operator_delete(fs_body._M_dataplus._M_p,fs_body.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void NegativeTest5::executeIteration(const Utils::_shader_stage& shader_stage)
{
	std::string fs_body = getFragmentShaderBody(shader_stage == Utils::SHADER_STAGE_FRAGMENT);
	std::string gs_body = getGeometryShaderBody(shader_stage == Utils::SHADER_STAGE_GEOMETRY);
	std::string tc_body = getTessellationControlShaderBody(shader_stage == Utils::SHADER_STAGE_TESSELLATION_CONTROL);
	std::string te_body =
		getTessellationEvaluationShaderBody(shader_stage == Utils::SHADER_STAGE_TESSELLATION_EVALUATION);
	std::string vs_body = getVertexShaderBody(shader_stage == Utils::SHADER_STAGE_VERTEX);

	if (Utils::buildProgram(m_context.getRenderContext().getFunctions(), vs_body, tc_body, te_body, gs_body, fs_body,
							DE_NULL, /* xfb_varyings */
							DE_NULL, /* n_xfb_varyings */
							&m_vs_id, &m_tc_id, &m_te_id, &m_gs_id, &m_fs_id, &m_po_id))
	{
		/* None of the test programs should ever build successfully */
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "A program object, consisting of the following shaders, has linked"
							  " correctly. One of the shaders defines a subroutine uniform but does "
							  "not implement any function that matches subroutine type of the uniform."
							  " This should have resulted in a compilation/link-time error.\n"
							  "\n"
							  "Vertex shader:\n"
							  "\n"
						   << vs_body << "\n"
										 "Tessellation control shader:\n"
										 "\n"
						   << tc_body << "\n"
										 "Tessellation evaluation shader:\n"
										 "\n"
						   << te_body << "\n"
										 "Geometry shader:\n"
										 "\n"
						   << gs_body << "\n"
										 "Fragment shader:\n"
										 "\n"
						   << fs_body << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	}
}